

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  size_t size;
  LodePNGDecompressSettings zlibsettings;
  
  size = 0;
  zlibsettings.custom_context = (decoder->zlibsettings).custom_context;
  zlibsettings.ignore_adler32 = (decoder->zlibsettings).ignore_adler32;
  zlibsettings.ignore_nlen = (decoder->zlibsettings).ignore_nlen;
  zlibsettings.max_output_size = (decoder->zlibsettings).max_output_size;
  zlibsettings.custom_zlib = (decoder->zlibsettings).custom_zlib;
  zlibsettings.custom_inflate = (decoder->zlibsettings).custom_inflate;
  info->iccp_defined = 1;
  if (info->iccp_name != (char *)0x0) {
    lodepng_clear_icc(info);
  }
  uVar4 = 2;
  while ((uVar5 = (ulong)(uVar4 - 2), uVar5 < chunkLength && (data[uVar5] != '\0'))) {
    uVar4 = uVar4 + 1;
  }
  if (uVar4 < chunkLength) {
    if (uVar4 - 0x52 < 0xffffffb1) {
      uVar4 = 0x59;
    }
    else {
      pcVar2 = (char *)malloc((ulong)(uVar4 - 1));
      info->iccp_name = pcVar2;
      if (pcVar2 == (char *)0x0) {
        uVar4 = 0x53;
      }
      else {
        pcVar2[uVar5] = '\0';
        for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          info->iccp_name[uVar3] = data[uVar3];
        }
        if (data[uVar4 - 1] == '\0') {
          zlibsettings.max_output_size = decoder->max_icc_size;
          uVar1 = zlib_decompress(&info->iccp_profile,&size,0,data + uVar4,
                                  (ulong)((int)chunkLength - uVar4),&zlibsettings);
          uVar4 = 0x71;
          if (size <= zlibsettings.max_output_size) {
            uVar4 = uVar1;
          }
          info->iccp_profile_size = (uint)size;
          if (((uVar1 == 0) || (uVar4 == 0)) && (uVar4 = 0, (uint)size == 0)) {
            uVar4 = 100;
          }
        }
        else {
          uVar4 = 0x48;
        }
      }
    }
  }
  else {
    uVar4 = 0x4b;
  }
  return uVar4;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;
  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;

  info->iccp_defined = 1;
  if(info->iccp_name) lodepng_clear_icc(info);

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  zlibsettings.max_output_size = decoder->max_icc_size;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, &zlibsettings);
  /*error: ICC profile larger than  decoder->max_icc_size*/
  if(error && size > zlibsettings.max_output_size) error = 113;
  info->iccp_profile_size = size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}